

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O3

void __thiscall
QtMWidgets::DateTimePicker::mouseReleaseEvent(DateTimePicker *this,QMouseEvent *event)

{
  DateTimePickerPrivate *this_00;
  QMouseEvent QVar1;
  
  if (*(int *)(event + 0x40) == 1) {
    this_00 = (this->d).d;
    QVar1 = (QMouseEvent)0x1;
    if ((this_00->leftMouseButtonPressed == true) && (this_00->scrolling == false)) {
      DateTimePickerPrivate::releaseScrolling(this_00);
    }
  }
  else {
    QVar1 = (QMouseEvent)0x0;
  }
  event[0xc] = QVar1;
  return;
}

Assistant:

void
DateTimePicker::mouseReleaseEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		if( d->leftMouseButtonPressed && !d->scrolling )
			d->releaseScrolling();

		event->accept();
	}
	else
		event->ignore();
}